

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O2

int testValidUpsampleAlignCorners(void)

{
  ulong uVar1;
  bool bVar2;
  ModelDescription *pMVar3;
  FeatureDescription *pFVar4;
  FeatureType *pFVar5;
  ArrayFeatureType *this;
  NeuralNetwork *pNVar6;
  NeuralNetworkLayer *this_00;
  UpsampleLayerParams *this_01;
  Model *pMVar7;
  ostream *poVar8;
  ostream *this_02;
  undefined8 *puVar9;
  uint uVar10;
  int iVar11;
  Model mlmodel;
  Model m1;
  Result res;
  
  CoreML::Specification::Model::Model(&m1);
  pMVar3 = CoreML::Specification::Model::_internal_mutable_description(&m1);
  pFVar4 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar3->input_);
  uVar1 = (pFVar4->super_MessageLite)._internal_metadata_.ptr_;
  puVar9 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar9 = (undefined8 *)*puVar9;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pFVar4->name_,"input",puVar9);
  pFVar5 = CoreML::Specification::FeatureDescription::_internal_mutable_type(pFVar4);
  this = CoreML::Specification::FeatureType::_internal_mutable_multiarraytype(pFVar5);
  CoreML::Specification::ArrayFeatureType::_internal_add_shape(this,5);
  CoreML::Specification::ArrayFeatureType::_internal_add_shape(this,5);
  CoreML::Specification::ArrayFeatureType::_internal_add_shape(this,5);
  pMVar3 = CoreML::Specification::Model::_internal_mutable_description(&m1);
  pFVar4 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar3->output_);
  uVar1 = (pFVar4->super_MessageLite)._internal_metadata_.ptr_;
  puVar9 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar9 = (undefined8 *)*puVar9;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pFVar4->name_,"probs",puVar9);
  pFVar5 = CoreML::Specification::FeatureDescription::_internal_mutable_type(pFVar4);
  CoreML::Specification::FeatureType::_internal_mutable_multiarraytype(pFVar5);
  pNVar6 = CoreML::Specification::Model::_internal_mutable_neuralnetwork(&m1);
  pNVar6->arrayinputshapemapping_ = 1;
  this_00 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                      (&pNVar6->layers_);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_00,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_00,"probs");
  this_01 = CoreML::Specification::NeuralNetworkLayer::_internal_mutable_upsample(this_00);
  CoreML::Specification::UpsampleLayerParams::_internal_add_scalingfactor(this_01,1);
  CoreML::Specification::UpsampleLayerParams::_internal_add_scalingfactor(this_01,1);
  this_01->mode_ = 1;
  this_01->linearupsamplemode_ = 2;
  CoreML::validate<(MLModelType)500>(&res,&m1);
  bVar2 = CoreML::Result::good(&res);
  if (bVar2) {
    this_01->linearupsamplemode_ = 1;
    CoreML::validate<(MLModelType)500>((Result *)&mlmodel,&m1);
    CoreML::Result::operator=(&res,(Result *)&mlmodel);
    std::__cxx11::string::~string((string *)&mlmodel.m_spec);
    bVar2 = CoreML::Result::good(&res);
    if (bVar2) {
      CoreML::Model::Model(&mlmodel,&m1);
      pMVar7 = CoreML::Model::getProto(&mlmodel);
      bVar2 = pMVar7->specificationversion_ != 5;
      if (bVar2) {
        poVar8 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                );
        poVar8 = std::operator<<(poVar8,":");
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0xc6d);
        poVar8 = std::operator<<(poVar8,": error: ");
        poVar8 = std::operator<<(poVar8,
                                 "mlmodel.getProto().specificationversion() == MLMODEL_SPECIFICATION_VERSION_IOS14"
                                );
        poVar8 = std::operator<<(poVar8," was false, expected true.");
        std::endl<char,std::char_traits<char>>(poVar8);
      }
      uVar10 = (uint)bVar2;
      CoreML::Model::~Model(&mlmodel);
      goto LAB_001501ca;
    }
    poVar8 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    this_02 = (ostream *)std::operator<<(poVar8,":");
    iVar11 = 0xc69;
  }
  else {
    poVar8 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    this_02 = (ostream *)std::operator<<(poVar8,":");
    iVar11 = 0xc64;
  }
  poVar8 = (ostream *)std::ostream::operator<<(this_02,iVar11);
  poVar8 = std::operator<<(poVar8,": error: ");
  poVar8 = std::operator<<(poVar8,"(res).good()");
  poVar8 = std::operator<<(poVar8," was false, expected true.");
  std::endl<char,std::char_traits<char>>(poVar8);
  uVar10 = 1;
LAB_001501ca:
  std::__cxx11::string::~string((string *)&res.m_message);
  CoreML::Specification::Model::~Model(&m1);
  return uVar10;
}

Assistant:

int testValidUpsampleAlignCorners() {

    Specification::Model m1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(5);
    shape->add_shape(5);
    shape->add_shape(5);

    auto *out3 = m1.mutable_description()->add_output();
    out3->set_name("probs");
    out3->mutable_type()->mutable_multiarraytype();

    const auto nn = m1.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);

    Specification::NeuralNetworkLayer *upsampleLayer = nn->add_layers();
    upsampleLayer->add_input("input");
    upsampleLayer->add_output("probs");
    auto *params = upsampleLayer->mutable_upsample();

    // Scaling factor needs to be 2D
    params->add_scalingfactor(1.0);
    params->add_scalingfactor(1.0);

    params->set_mode(Specification::UpsampleLayerParams_InterpolationMode_BILINEAR);
    params->set_linearupsamplemode(Specification::UpsampleLayerParams_LinearUpsampleMode_ALIGN_CORNERS_FALSE);

    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_GOOD(res);

    params->set_linearupsamplemode(Specification::UpsampleLayerParams_LinearUpsampleMode_ALIGN_CORNERS_TRUE);

    res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_GOOD(res);

    // Check that the new field sets spec version to ios 14
    Model mlmodel = Model(m1);
    ML_ASSERT(mlmodel.getProto().specificationversion() == MLMODEL_SPECIFICATION_VERSION_IOS14);
    return 0;
}